

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::TransferTest::createInstance(TransferTest *this,Context *context)

{
  VkAllocationCallbacks **this_00;
  undefined4 uVar1;
  VkCommandBuffer_s *pVVar2;
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar3;
  StageFlagVector *pSVar4;
  VkAllocationCallbacks **this_01;
  TimestampTestInstance *this_02;
  DeviceInterface *vkd;
  VkDevice device;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_d8;
  VkAllocationCallbacks *local_b8;
  DeviceInterface *pDStack_b0;
  VkDevice local_a8;
  VkAllocationCallbacks *pVStack_a0;
  Move<vk::Handle<(vk::HandleType)24>_> *local_98;
  StageFlagVector *local_90;
  Move<vk::Handle<(vk::HandleType)6>_> *local_88;
  VkDevice *local_80;
  VkAllocationCallbacks **local_78;
  Move<vk::VkCommandBuffer_s_*> *local_70;
  VkDevice *local_68;
  Move<vk::Handle<(vk::HandleType)24>_> *local_60;
  StageFlagVector *local_58;
  Move<vk::VkCommandBuffer_s_*> *local_50;
  _Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> local_48;
  
  this_02 = (TimestampTestInstance *)operator_new(0x200);
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            ((vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> *)
             &local_48,&(this->super_TimestampTest).m_stages);
  uVar1 = *(undefined4 *)&(this->super_TimestampTest).field_0x8c;
  TimestampTestInstance::TimestampTestInstance
            (this_02,context,(StageFlagVector *)&local_48,(this->super_TimestampTest).m_inRenderPass
            );
  (this_02->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TransferTestInstance_00bf9fc8;
  *(undefined4 *)&this_02[1].super_TestInstance._vptr_TestInstance = uVar1;
  this_02[1].super_TestInstance.m_context = (Context *)0x100;
  local_58 = &this_02[1].m_stages;
  local_60 = &this_02[1].m_cmdPool;
  local_68 = &this_02[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  this_02[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this_02[1].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_02[1].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_02[1].m_stages.
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&this_02[1].m_inRenderPass = 0;
  this_02[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  this_02[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  this_02[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  this_02[1].m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  this_02[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
       0x400000025;
  *(undefined4 *)
   &this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       4;
  this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x100;
  this_00 = &this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
             m_allocator;
  local_78 = &this_02[1].m_queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
              m_allocator;
  local_90 = &this_02[2].m_stages;
  local_98 = &this_02[2].m_cmdPool;
  local_70 = &this_02[2].m_cmdBuffer;
  local_80 = &this_02[2].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  this_02[2].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_88 = &this_02[2].m_fence;
  this_02[2].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  this_02[2].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  memset(this_00,0,0x88);
  local_50 = &this_02[1].m_cmdBuffer;
  vkd = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  TimestampTestInstance::createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&local_d8,this_02,
             (VkDeviceSize)this_02[1].super_TestInstance.m_context,0x21,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&this_02[1].m_cmdBuffer
            );
  pSVar4 = local_58;
  local_a8 = local_d8.m_data.deleter.m_device;
  pVStack_a0 = local_d8.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)local_d8.m_data.object.m_internal;
  pDStack_b0 = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_58);
  (pSVar4->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8;
  *(VkAllocationCallbacks **)(pSVar4 + 1) = pVStack_a0;
  (pSVar4->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
  (pSVar4->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)pDStack_b0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_d8);
  memset(*(void **)(this_02[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object +
                   0x18),0xff,(size_t)this_02[1].super_TestInstance.m_context);
  pVVar2 = this_02[1].m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)*(deUint64 *)(pVVar2 + 8),*(VkDeviceSize *)(pVVar2 + 0x10),
             (VkDeviceSize)this_02[1].super_TestInstance.m_context);
  pMVar3 = local_60;
  TimestampTestInstance::createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&local_d8,this_02,
             (VkDeviceSize)this_02[1].super_TestInstance.m_context,0x22,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_68);
  local_a8 = local_d8.m_data.deleter.m_device;
  pVStack_a0 = local_d8.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)local_d8.m_data.object.m_internal;
  pDStack_b0 = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)pMVar3);
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_device = local_a8;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_allocator = pVStack_a0;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       (deUint64)local_b8;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_deviceIface = pDStack_b0
  ;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_d8);
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,this_02,
             (VkFormat)
             this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
             m_internal,
             *(deUint32 *)
              ((long)&this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                      .m_internal + 4),
             *(deUint32 *)
              &this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
               m_deviceIface,3,VK_SAMPLE_COUNT_1_BIT,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_70);
  this_01 = local_78;
  local_a8 = local_d8.m_data.deleter.m_device;
  pVStack_a0 = local_d8.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)local_d8.m_data.object.m_internal;
  pDStack_b0 = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)this_00);
  this_02[1].m_queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_a8;
  this_02[1].m_queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device =
       (VkDevice)pVStack_a0;
  *this_00 = local_b8;
  this_02[1].m_queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal =
       (deUint64)pDStack_b0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&local_d8);
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,this_02,
             (VkFormat)
             this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
             m_internal,
             *(deUint32 *)
              ((long)&this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                      .m_internal + 4),
             *(deUint32 *)
              &this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
               m_deviceIface,0x12,VK_SAMPLE_COUNT_1_BIT,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_80);
  local_a8 = local_d8.m_data.deleter.m_device;
  pVStack_a0 = local_d8.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)local_d8.m_data.object.m_internal;
  pDStack_b0 = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)this_01);
  this_01[2] = (VkAllocationCallbacks *)local_a8;
  this_01[3] = pVStack_a0;
  *this_01 = local_b8;
  this_01[1] = (VkAllocationCallbacks *)pDStack_b0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&local_d8);
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,this_02,VK_FORMAT_D16_UNORM,
             *(deUint32 *)
              ((long)&this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                      .m_internal + 4),
             *(deUint32 *)
              &this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
               m_deviceIface,2,VK_SAMPLE_COUNT_1_BIT,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_88);
  pSVar4 = local_90;
  local_a8 = local_d8.m_data.deleter.m_device;
  pVStack_a0 = local_d8.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)local_d8.m_data.object.m_internal;
  pDStack_b0 = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_90);
  (pSVar4->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8;
  *(VkAllocationCallbacks **)(pSVar4 + 1) = pVStack_a0;
  (pSVar4->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
  (pSVar4->
  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)pDStack_b0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&local_d8);
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,this_02,
             (VkFormat)
             this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
             m_internal,
             *(deUint32 *)
              ((long)&this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object
                      .m_internal + 4),
             *(deUint32 *)
              &this_02[1].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
               m_deviceIface,0x13,VK_SAMPLE_COUNT_4_BIT,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &this_02[2].m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
              m_device);
  pMVar3 = local_98;
  local_a8 = local_d8.m_data.deleter.m_device;
  pVStack_a0 = local_d8.m_data.deleter.m_allocator;
  local_b8 = (VkAllocationCallbacks *)local_d8.m_data.object.m_internal;
  pDStack_b0 = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_98);
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_device = local_a8;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_allocator = pVStack_a0;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       (deUint64)local_b8;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_deviceIface = pDStack_b0
  ;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&local_d8);
  std::_Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::
  ~_Vector_base(&local_48);
  return &this_02->super_TestInstance;
}

Assistant:

TestInstance* TransferTest::createInstance(Context& context) const
{
  return new TransferTestInstance(context, m_stages, m_inRenderPass, m_method);
}